

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86_avx512::forward_inplace(Dropout_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  float *pfVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  undefined1 local_68 [32];
  Allocator *local_48;
  int iStack_40;
  int iStack_3c;
  undefined1 auStack_38 [12];
  size_t local_28;
  
  fVar2 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx512[-3]);
  if (fVar2 != 1.0) {
    iVar10 = bottom_top_blob->elempack;
    iVar17 = bottom_top_blob->dims;
    if (iVar10 == 4) {
      uVar13 = bottom_top_blob->w;
      uVar16 = bottom_top_blob->h;
      if (iVar17 == 3) {
        uVar14 = 0;
        iVar10 = uVar16 * uVar13;
        if ((int)(uVar16 * uVar13) < 1) {
          iVar10 = 0;
        }
        uVar12 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar12 = 0;
        }
        for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          pfVar15 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar17 = iVar10;
          while (bVar18 = iVar17 != 0, iVar17 = iVar17 + -1, bVar18) {
            *pfVar15 = fVar2 * *pfVar15;
            pfVar15[1] = fVar2 * pfVar15[1];
            pfVar15[2] = fVar2 * pfVar15[2];
            pfVar15[3] = fVar2 * pfVar15[3];
            pfVar15 = pfVar15 + 4;
          }
        }
      }
      else if (iVar17 == 2) {
        uVar14 = 0;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        uVar12 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar12 = 0;
        }
        for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          pfVar15 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar16 = uVar13;
          while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
            *pfVar15 = fVar2 * *pfVar15;
            pfVar15[1] = fVar2 * pfVar15[1];
            pfVar15[2] = fVar2 * pfVar15[2];
            pfVar15[3] = fVar2 * pfVar15[3];
            pfVar15 = pfVar15 + 4;
          }
        }
      }
      else if (iVar17 == 1) {
        lVar11 = 0;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (; (ulong)uVar13 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar11);
          fVar3 = pfVar15[1];
          fVar4 = pfVar15[2];
          fVar5 = pfVar15[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar11);
          *pfVar1 = fVar2 * *pfVar15;
          pfVar1[1] = fVar2 * fVar3;
          pfVar1[2] = fVar2 * fVar4;
          pfVar1[3] = fVar2 * fVar5;
        }
      }
    }
    else if (iVar10 == 8) {
      uVar13 = bottom_top_blob->w;
      uVar16 = bottom_top_blob->h;
      if (iVar17 == 3) {
        uVar14 = 0;
        iVar10 = uVar16 * uVar13;
        if ((int)(uVar16 * uVar13) < 1) {
          iVar10 = 0;
        }
        uVar12 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar12 = 0;
        }
        for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          pfVar15 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar17 = iVar10;
          while (bVar18 = iVar17 != 0, iVar17 = iVar17 + -1, bVar18) {
            *pfVar15 = fVar2 * *pfVar15;
            pfVar15[1] = fVar2 * pfVar15[1];
            pfVar15[2] = fVar2 * pfVar15[2];
            pfVar15[3] = fVar2 * pfVar15[3];
            pfVar15[4] = fVar2 * pfVar15[4];
            pfVar15[5] = fVar2 * pfVar15[5];
            pfVar15[6] = fVar2 * pfVar15[6];
            pfVar15[7] = 0.0;
            pfVar15 = pfVar15 + 8;
          }
        }
      }
      else if (iVar17 == 2) {
        uVar14 = 0;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        uVar12 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar12 = 0;
        }
        for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          pfVar15 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar16 = uVar13;
          while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
            *pfVar15 = fVar2 * *pfVar15;
            pfVar15[1] = fVar2 * pfVar15[1];
            pfVar15[2] = fVar2 * pfVar15[2];
            pfVar15[3] = fVar2 * pfVar15[3];
            pfVar15[4] = fVar2 * pfVar15[4];
            pfVar15[5] = fVar2 * pfVar15[5];
            pfVar15[6] = fVar2 * pfVar15[6];
            pfVar15[7] = 0.0;
            pfVar15 = pfVar15 + 8;
          }
        }
      }
      else if (iVar17 == 1) {
        lVar11 = 0;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (; (ulong)uVar13 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar11);
          fVar3 = pfVar15[1];
          fVar4 = pfVar15[2];
          fVar5 = pfVar15[3];
          fVar6 = pfVar15[4];
          fVar7 = pfVar15[5];
          fVar8 = pfVar15[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar11);
          *pfVar1 = fVar2 * *pfVar15;
          pfVar1[1] = fVar2 * fVar3;
          pfVar1[2] = fVar2 * fVar4;
          pfVar1[3] = fVar2 * fVar5;
          pfVar1[4] = fVar2 * fVar6;
          pfVar1[5] = fVar2 * fVar7;
          pfVar1[6] = fVar2 * fVar8;
          pfVar1[7] = 0.0;
        }
      }
    }
    else {
      if (iVar10 != 0x10) {
        iVar10 = Dropout::forward_inplace
                           ((Dropout *)
                            ((long)&this->_vptr_Dropout_x86_avx512 +
                            (long)this->_vptr_Dropout_x86_avx512[-3]),bottom_top_blob,opt);
        return iVar10;
      }
      local_28 = 0;
      local_68._0_8_ = (void *)0x0;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      local_68._24_4_ = 0;
      local_68._16_8_ = SUB128(ZEXT812(0),4);
      local_48 = (Allocator *)0x0;
      iStack_40 = 0;
      auStack_38._8_4_ = 0;
      auStack_38._0_8_ = SUB128(ZEXT812(0),4);
      iStack_3c = local_68._12_4_;
      convert_packing(bottom_top_blob,(Mat *)local_68,8,opt);
      (**this->_vptr_Dropout_x86_avx512)(this,local_68,opt);
      convert_packing((Mat *)local_68,bottom_top_blob,0x10,opt);
      piVar9 = (int *)CONCAT44(local_68._12_4_,local_68._8_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_48 == (Allocator *)0x0) {
            free((void *)local_68._0_8_);
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}